

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_exception.hpp
# Opt level: O3

void __thiscall
duckdb::ParserException::ParserException<char_const*>
          (ParserException *this,string *msg,char *params)

{
  char *in_RCX;
  string local_30;
  
  Exception::ConstructMessage<char_const*>(&local_30,(Exception *)msg,(string *)params,in_RCX);
  ParserException(this,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

explicit ParserException(const string &msg, ARGS... params) : ParserException(ConstructMessage(msg, params...)) {
	}